

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

QDebug operator<<(QDebug *debug,QDockAreaLayout *layout)

{
  QDebug *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  QDockAreaLayout *in_stack_00000040;
  QTextStream *in_stack_00000048;
  QTextStream str;
  QString s;
  undefined4 in_stack_ffffffffffffff78;
  OpenModeFlag in_stack_ffffffffffffff7c;
  Stream *t;
  uint local_3c;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  t = in_RDI;
  QString::QString((QString *)0x5f0027);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  QFlags<QIODeviceBase::OpenModeFlag>::QFlags
            ((QFlags<QIODeviceBase::OpenModeFlag> *)in_RDI,in_stack_ffffffffffffff7c);
  QTextStream::QTextStream
            ((QTextStream *)&local_38,(QString *)&local_28,(QFlags_conflict1 *)(ulong)local_3c);
  dumpLayout(in_stack_00000048,in_stack_00000040);
  QDebug::operator<<(in_RSI,(QString *)t);
  QDebug::QDebug((QDebug *)in_RDI,
                 (QDebug *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  QTextStream::~QTextStream((QTextStream *)&local_38);
  QString::~QString((QString *)0x5f009b);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QDebug)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug debug, const QDockAreaLayout &layout)
{
    QString s;
    QTextStream str(&s);
    dumpLayout(str, layout);
    debug << s;
    return debug;
}